

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::Pxr24Compressor::compress
          (Pxr24Compressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  int iVar1;
  Box2i local_10;
  
  local_10.min.x = this->_minX;
  local_10.max.x = this->_maxX;
  local_10.max.y = minY + -1 + this->_numScanLines;
  local_10.min.y = minY;
  iVar1 = compress(this,inPtr,inSize,&local_10,outPtr);
  return iVar1;
}

Assistant:

int
Pxr24Compressor::compress (const char *inPtr,
			   int inSize,
			   int minY,
			   const char *&outPtr)
{
    return compress (inPtr,
	             inSize,
		     Box2i (V2i (_minX, minY),
			    V2i (_maxX, minY + _numScanLines - 1)),
		     outPtr);
}